

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TgSimpleEnumeration(Abc_TgMan_t *pMan)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  int pGid [16];
  undefined8 uStack_80;
  int local_78 [18];
  
  iVar6 = pMan->nGroups;
  if ((long)iVar6 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      cVar1 = pMan->pGroup[lVar5].nGVars;
      if ('\0' < cVar1) {
        lVar7 = 0;
        do {
          local_78[iVar4 + lVar7] = (int)lVar5;
          lVar7 = lVar7 + 1;
        } while ((int)cVar1 != (int)lVar7);
        iVar4 = iVar4 + (int)lVar7;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar6);
  }
  if (iVar4 != pMan->nGVars) {
    uStack_80 = (code *)0x50181a;
    __assert_fail("k == pMan->nGVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x866,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  iVar6 = 0;
  do {
    uVar8 = 0;
    if (1 < pMan->nGVars) {
      uVar8 = 0;
      lVar5 = (ulong)(pMan->nGVars - 2) + 1;
      do {
        iVar4 = *(int *)((long)&uStack_80 + lVar5 * 4 + 4);
        if (iVar4 == local_78[lVar5]) {
          uVar3 = 1;
          if (iVar4 < 1) {
            uVar3 = (uint)(pMan->fPhased != 0);
          }
          uStack_80 = (code *)0x501722;
          uVar3 = Abc_TgSymGroupPerm(pMan,(int)lVar5 + -1,uVar3);
          uVar8 = uVar8 | uVar3;
        }
        lVar7 = lVar5 + -1;
        bVar2 = 0 < lVar5;
        lVar5 = lVar7;
      } while (lVar7 != 0 && bVar2);
    }
    if (2 < pMan->nGVars) {
      lVar5 = 1;
      do {
        if (local_78[lVar5] == local_78[lVar5 + 1]) {
          uVar3 = 1;
          if (local_78[lVar5] < 1) {
            uVar3 = (uint)(pMan->fPhased != 0);
          }
          uStack_80 = (code *)0x50175e;
          uVar3 = Abc_TgSymGroupPerm(pMan,(int)lVar5,uVar3);
          uVar8 = uVar8 | uVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (long)pMan->nGVars + -1);
    }
    lVar5 = (long)pMan->nVars;
    if (0 < (long)pMan->nVars) {
      do {
        if ((&pMan->pGroup[0xf].nGVars)[lVar5] != '\0') {
          uStack_80 = (code *)0x50178d;
          uVar3 = Abc_TgPermPhase(pMan,(int)lVar5 + -1);
          uVar8 = uVar8 | uVar3;
        }
        bVar2 = 1 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar2);
    }
    if (1 < pMan->nVars) {
      lVar5 = 1;
      pcVar9 = pMan->symPhase;
      do {
        pcVar9 = pcVar9 + 1;
        if (*pcVar9 != '\0') {
          uStack_80 = (code *)0x5017be;
          uVar3 = Abc_TgPermPhase(pMan,(int)lVar5);
          uVar8 = uVar8 | uVar3;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pMan->nVars);
    }
  } while ((uVar8 != 0) && (iVar6 = iVar6 + 1, iVar6 != 5));
  uStack_80 = (code *)0x5017e8;
  iVar6 = Abc_TgCannonVerify(pMan);
  if (iVar6 == 0) {
    uStack_80 = Abc_TtCanonicizeCA;
    __assert_fail("Abc_TgCannonVerify(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                  ,0x87a,"void Abc_TgSimpleEnumeration(Abc_TgMan_t *)");
  }
  return;
}

Assistant:

static void Abc_TgSimpleEnumeration(Abc_TgMan_t * pMan)
{
    int i, j, k;
    int pGid[16];

    for (k = j = 0; j < pMan->nGroups; j++)
        for (i = 0; i < pMan->pGroup[j].nGVars; i++, k++)
            pGid[k] = j;
    assert(k == pMan->nGVars);

    for (k = 0; k < 5; k++)
    {
        int fChanges = 0;
        for (i = pMan->nGVars - 2; i >= 0; i--)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);
        for (i = 1; i < pMan->nGVars - 1; i++)
            if (pGid[i] == pGid[i + 1])
                fChanges |= Abc_TgSymGroupPerm(pMan, i, pGid[i] > 0 || pMan->fPhased);

        for (i = pMan->nVars - 1; i >= 0; i--)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        for (i = 1; i < pMan->nVars; i++)
            if (pMan->symPhase[i])
                fChanges |= Abc_TgPermPhase(pMan, i);
        if (!fChanges) break;
    }
    assert(Abc_TgCannonVerify(pMan));
}